

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>
          (StringTree *this,anon_class_8_1_6ec8c47f *func)

{
  size_t sVar1;
  Branch *pBVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  long lVar6;
  StringTree *this_00;
  uint local_6c;
  unsigned_long local_68;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  
  sVar1 = (this->branches).size_;
  if (sVar1 == 0) {
    uVar5 = 0;
  }
  else {
    pBVar2 = (this->branches).ptr;
    lVar6 = sVar1 << 6;
    uVar5 = 0;
    do {
      this_00 = &pBVar2->content;
      uVar3 = *(ulong *)((long)(this_00 + -1) + 0x30);
      uVar4 = uVar3 - uVar5;
      if (uVar5 <= uVar3 && uVar4 != 0) {
        *func->pieceCount = *func->pieceCount + 1;
        _kjCondition.left = 3;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = uVar4 == 3;
        uVar5 = uVar3;
        _kjCondition.right = uVar4;
        if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
          local_6c = 3;
          local_68 = uVar4;
          kj::_::Debug::
          log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                     ,0x28,ERROR,
                     "\"failed: expected \" \"(3u) == (part.size())\", _kjCondition, 3u, part.size()"
                     ,(char (*) [39])"failed: expected (3u) == (part.size())",&_kjCondition,
                     &local_6c,&local_68);
          uVar5 = *(ulong *)((long)(this_00 + -1) + 0x30);
        }
      }
      visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>(this_00,func);
      pBVar2 = (Branch *)(this_00 + 1);
      lVar6 = lVar6 + -0x40;
    } while (lVar6 != 0);
  }
  sVar1 = (this->text).content.size_;
  uVar3 = 0;
  if (sVar1 != 0) {
    uVar3 = sVar1 - 1;
  }
  local_68 = uVar3 - uVar5;
  if (uVar5 <= uVar3 && local_68 != 0) {
    *func->pieceCount = *func->pieceCount + 1;
    _kjCondition.left = 3;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 == 3;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_6c = 3;
      _kjCondition.right = local_68;
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x28,ERROR,
                 "\"failed: expected \" \"(3u) == (part.size())\", _kjCondition, 3u, part.size()",
                 (char (*) [39])"failed: expected (3u) == (part.size())",&_kjCondition,&local_6c,
                 &local_68);
    }
  }
  return;
}

Assistant:

void StringTree::visit(Func&& func) const {
  size_t pos = 0;
  for (auto& branch: branches) {
    if (branch.index > pos) {
      func(text.slice(pos, branch.index));
      pos = branch.index;
    }
    branch.content.visit(func);
  }
  if (text.size() > pos) {
    func(text.slice(pos, text.size()));
  }
}